

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O3

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitPowConstExp(EExpr *__return_storage_ptr__,
                  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *this,BinaryExpr e)

{
  type tVar1;
  int *piVar2;
  ulong uVar3;
  EExpr el;
  undefined1 local_1d8 [32];
  type local_1b8;
  type local_1b0;
  type local_1a8;
  ptr local_190;
  ulong local_188;
  ptr local_160;
  ulong local_158;
  ptr local_c8;
  ulong local_c0;
  ptr local_80;
  ulong local_78;
  ptr local_50;
  ulong local_48;
  
  piVar2 = (int *)0x0;
  if (**(int **)((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.
                       impl_ + 0x10) == 1) {
    piVar2 = *(int **)((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.
                             super_ExprBase.impl_ + 0x10);
  }
  tVar1 = *(type *)((type *)(piVar2 + 2))->__data;
  if (((((double)tVar1 != 2.0) || (NAN((double)tVar1))) || (this->ifFltCon_ != 0)) ||
     ((this->flat_cvt_).
      super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      .
      super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      .options_.passQuadObj_ == 0)) {
    local_1b0._0_4_ =
         Convert2Var(this,(Expr)((ExprBase *)
                                ((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.
                                       super_ExprBase.impl_ + 8))->impl_);
    local_1d8._8_8_ = 0;
    local_1d8[0x10] = '\0';
    local_1b8 = (type)0xffffffff;
    local_1d8._0_8_ = local_1d8 + 0x10;
    local_1a8 = tVar1;
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::
    AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
              (__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
                *)this,(CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
                        *)local_1d8);
    if ((undefined1 *)local_1d8._0_8_ == local_1d8 + 0x10) {
      return __return_storage_ptr__;
    }
    uVar3 = CONCAT71(local_1d8._17_7_,local_1d8[0x10]) + 1;
  }
  else {
    BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
    ::Visit((EExpr *)local_1d8,
            (BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
             *)this,(Expr)((ExprBase *)
                          ((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.
                                 super_ExprBase.impl_ + 8))->impl_);
    QuadratizeOrLinearize(__return_storage_ptr__,this,(EExpr *)local_1d8,(EExpr *)local_1d8);
    if (6 < local_48) {
      operator_delete(local_50,local_48 << 2);
    }
    if (6 < local_78) {
      operator_delete(local_80,local_78 << 2);
    }
    if (6 < local_c0) {
      operator_delete(local_c8,local_c0 << 3);
    }
    if (8 < local_158) {
      operator_delete(local_160,local_158 << 4);
    }
    if (6 < local_188) {
      operator_delete(local_190,local_188 << 2);
    }
    if ((ulong)local_1d8._8_8_ < 7) {
      return __return_storage_ptr__;
    }
    uVar3 = local_1d8._8_8_ << 3;
  }
  operator_delete((void *)local_1d8._0_8_,uVar3);
  return __return_storage_ptr__;
}

Assistant:

EExpr VisitPowConstExp(BinaryExpr e) {
    auto c = Cast<NumericConstant>(e.rhs()).value();
    if (2.0==c && IfQuadratizePow2()) {
      auto el = Convert2EExpr(e.lhs());
      return QuadratizeOrLinearize(el, el);
    }
    return AssignResult2Args( PowConstExpConstraint(
      PowConstExpConstraint::Arguments{ Convert2Var(e.lhs()) },
      PowConstExpConstraint::Parameters{ c } ) );
  }